

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeAddContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlNodePtr first;
  int iVar1;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar2;
  xmlChar *pxVar3;
  xmlNodePtr tmp;
  xmlNodePtr newNode;
  xmlNodePtr last;
  int len_local;
  xmlChar *content_local;
  xmlNodePtr cur_local;
  
  if ((cur != (xmlNodePtr)0x0) && (0 < len)) {
    switch(cur->type) {
    case XML_ELEMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
      first = cur->last;
      cur_00 = xmlNewDocTextLen(cur->doc,content,len);
      if (((cur_00 != (xmlNodePtr)0x0) && (pxVar2 = xmlAddChild(cur,cur_00), pxVar2 == cur_00)) &&
         ((first != (xmlNodePtr)0x0 && (first->next == cur_00)))) {
        xmlTextMerge(first,cur_00);
      }
      break;
    case XML_ATTRIBUTE_NODE:
      break;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
    case XML_ENTITY_REF_NODE:
    case XML_ENTITY_NODE:
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
    case XML_NOTATION_NODE:
      if (content != (xmlChar *)0x0) {
        if (((_xmlAttr **)cur->content == &cur->properties) ||
           (((cur->doc != (_xmlDoc *)0x0 && (cur->doc->dict != (_xmlDict *)0x0)) &&
            (iVar1 = xmlDictOwns(cur->doc->dict,cur->content), iVar1 != 0)))) {
          pxVar3 = xmlStrncatNew(cur->content,content,len);
          cur->content = pxVar3;
          cur->properties = (_xmlAttr *)0x0;
        }
        else {
          pxVar3 = xmlStrncat(cur->content,content,len);
          cur->content = pxVar3;
        }
      }
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_HTML_DOCUMENT_NODE:
    case XML_DTD_NODE:
    case XML_NAMESPACE_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      break;
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    }
  }
  return;
}

Assistant:

void
xmlNodeAddContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeAddContentLen : node == NULL\n");
#endif
	return;
    }
    if (len <= 0) return;
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE: {
	    xmlNodePtr last, newNode, tmp;

	    last = cur->last;
	    newNode = xmlNewDocTextLen(cur->doc, content, len);
	    if (newNode != NULL) {
		tmp = xmlAddChild(cur, newNode);
		if (tmp != newNode)
		    return;
	        if ((last != NULL) && (last->next == newNode)) {
		    xmlTextMerge(last, newNode);
		}
	    }
	    break;
	}
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if (content != NULL) {
	        if ((cur->content == (xmlChar *) &(cur->properties)) ||
		    ((cur->doc != NULL) && (cur->doc->dict != NULL) &&
			    xmlDictOwns(cur->doc->dict, cur->content))) {
		    cur->content = xmlStrncatNew(cur->content, content, len);
		    cur->properties = NULL;
		} else {
		    cur->content = xmlStrncat(cur->content, content, len);
                }
            }
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	    break;
    }
}